

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRGraphicsWindowNode.cpp
# Opt level: O0

VRDisplayNode *
MinVR::VRGraphicsWindowNode::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  int iVar1;
  int iVar2;
  int iVar3;
  VRAnyCoreType settings_00;
  ostream *poVar4;
  VRDisplayNode *pVVar5;
  string *in_RDX;
  VRDataIndex *in_RSI;
  long *in_RDI;
  VRDisplayNode *node;
  VRWindowSettings settings;
  VRWindowToolkit *winToolkit;
  string wtk;
  VRGraphicsToolkit *gfxToolkit;
  string gtk;
  string nodeNameSpace;
  VRDatumConverter<MinVR::VRDatum> *in_stack_fffffffffffff5b8;
  allocator<char> *in_stack_fffffffffffff5f0;
  allocator<char> *__a;
  undefined4 in_stack_fffffffffffff5f8;
  undefined4 in_stack_fffffffffffff5fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff600;
  undefined4 in_stack_fffffffffffff62c;
  undefined1 uVar6;
  string *in_stack_fffffffffffff630;
  VRDataIndex *nameSpace_00;
  int *in_stack_fffffffffffff638;
  allocator<char> *defaultVal;
  undefined4 in_stack_fffffffffffff640;
  undefined4 in_stack_fffffffffffff644;
  VRDataIndex *in_stack_fffffffffffff648;
  VRDataIndex *this;
  string *in_stack_fffffffffffff650;
  undefined4 in_stack_fffffffffffff658;
  undefined4 in_stack_fffffffffffff65c;
  string *in_stack_fffffffffffff660;
  VRDataIndex *in_stack_fffffffffffff668;
  undefined8 in_stack_fffffffffffff810;
  undefined1 inherit;
  VRDataIndex *nameSpace_01;
  string *key;
  VRDataIndex *in_stack_fffffffffffff828;
  VRGraphicsWindowNode *in_stack_fffffffffffff830;
  allocator<char> local_7a9;
  string local_7a8 [32];
  string local_788 [32];
  undefined4 local_768;
  allocator<char> local_761;
  string local_760 [32];
  string local_740 [32];
  undefined4 local_720;
  allocator<char> local_719;
  string local_718 [32];
  string local_6f8 [32];
  undefined4 local_6d8;
  allocator<char> local_6d1;
  string local_6d0 [32];
  string local_6b0 [32];
  undefined4 local_690;
  allocator<char> local_689;
  string local_688 [32];
  string local_668 [32];
  undefined4 local_648;
  allocator<char> local_641;
  string local_640 [32];
  string local_620 [32];
  undefined4 local_600;
  allocator<char> local_5f9;
  string local_5f8 [32];
  string local_5d8 [32];
  undefined4 local_5b8;
  allocator<char> local_5b1;
  string local_5b0 [32];
  string local_590 [32];
  undefined4 local_570;
  allocator<char> local_569;
  string local_568 [32];
  string local_548 [32];
  undefined4 local_528;
  allocator<char> local_521;
  string local_520 [32];
  string local_500 [32];
  undefined4 local_4e0;
  allocator<char> local_4d9;
  string local_4d8 [32];
  string local_4b8 [32];
  undefined4 local_498;
  allocator<char> local_491;
  string local_490 [32];
  string local_470 [32];
  undefined4 local_450;
  allocator<char> local_449;
  string local_448 [32];
  string local_428 [32];
  undefined4 local_408;
  allocator<char> local_401;
  string local_400 [32];
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [39];
  allocator<char> local_391;
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  undefined4 local_330;
  allocator<char> local_329;
  string local_328 [32];
  string local_308 [32];
  undefined4 local_2e8;
  allocator<char> local_2e1;
  string local_2e0 [32];
  string local_2c0 [32];
  undefined4 local_2a0;
  allocator<char> local_299;
  string local_298 [32];
  string local_278 [32];
  undefined4 local_258;
  allocator<char> local_251;
  string local_250 [32];
  string local_230 [32];
  undefined4 local_210;
  allocator<char> local_209;
  string local_208 [32];
  string local_1e8 [32];
  undefined4 local_1c8;
  allocator<char> local_1c1;
  string local_1c0 [32];
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  undefined1 local_190;
  string local_188 [32];
  undefined1 local_168;
  undefined1 local_167;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  undefined1 local_148;
  undefined1 local_147;
  undefined1 local_146;
  undefined1 local_145;
  undefined1 local_144;
  int local_140;
  long local_138;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  VRDatum_conflict *local_e8;
  string local_e0 [32];
  long local_c0;
  string local_b8 [55];
  undefined1 local_81 [33];
  VRDatum_conflict *local_60;
  string local_58 [32];
  string local_38 [32];
  string *local_18;
  VRDataIndex *local_10;
  long *local_8;
  
  uVar6 = (undefined1)((uint)in_stack_fffffffffffff62c >> 0x18);
  inherit = (undefined1)((ulong)in_stack_fffffffffffff810 >> 0x38);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_38,in_RDX);
  key = (string *)local_81;
  nameSpace_01 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  std::__cxx11::string::string(local_b8,local_38);
  settings_00 = VRDataIndex::getValue
                          (in_stack_fffffffffffff828,key,(string *)nameSpace_01,(bool)inherit);
  local_60 = settings_00.datum;
  VRDatumConverter::operator_cast_to_string(in_stack_fffffffffffff5b8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  local_c0 = (**(code **)(*local_8 + 0x28))(local_8,local_58);
  if (local_c0 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Cannot get the graphics toolkit named: ");
    poVar4 = std::operator<<(poVar4,local_58);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  std::__cxx11::string::string(local_130,local_18);
  local_e8 = (VRDatum_conflict *)
             VRDataIndex::getValue
                       (in_stack_fffffffffffff828,key,(string *)nameSpace_01,
                        SUB81((ulong)settings_00.datum >> 0x38,0));
  VRDatumConverter::operator_cast_to_string(in_stack_fffffffffffff5b8);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  local_138 = (**(code **)(*local_8 + 0x30))(local_8,local_e0);
  if (local_138 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Cannot get the window toolkit named: ");
    poVar4 = std::operator<<(poVar4,local_e0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  VRWindowSettings::VRWindowSettings((VRWindowSettings *)0x1718c5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_1c8 = 100;
  std::__cxx11::string::string(local_1e8,local_18);
  local_1a0 = VRDataIndex::getValueWithDefault<int>
                        (in_stack_fffffffffffff648,
                         (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_210 = 100;
  std::__cxx11::string::string(local_230,local_18);
  local_19c = VRDataIndex::getValueWithDefault<int>
                        (in_stack_fffffffffffff648,
                         (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_258 = 0x280;
  std::__cxx11::string::string(local_278,local_18);
  local_198 = VRDataIndex::getValueWithDefault<int>
                        (in_stack_fffffffffffff648,
                         (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_2a0 = 0x280;
  std::__cxx11::string::string(local_2c0,local_18);
  local_194 = VRDataIndex::getValueWithDefault<int>
                        (in_stack_fffffffffffff648,
                         (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_2e8 = 0;
  std::__cxx11::string::string(local_308,local_18);
  iVar1 = VRDataIndex::getValueWithDefault<int>
                    (in_stack_fffffffffffff648,
                     (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                     in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  local_190 = iVar1 != 0;
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_330 = 0;
  std::__cxx11::string::string(local_350,local_18);
  iVar1 = VRDataIndex::getValueWithDefault<int>
                    (in_stack_fffffffffffff648,
                     (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                     in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  local_167 = iVar1 != 0;
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  std::__cxx11::string::string(local_3e0,local_18);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),in_stack_fffffffffffff650
             ,SUB81((ulong)in_stack_fffffffffffff648 >> 0x38,0));
  std::__cxx11::string::operator=(local_188,local_370);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_408 = 0;
  std::__cxx11::string::string(local_428,local_18);
  iVar1 = VRDataIndex::getValueWithDefault<int>
                    (in_stack_fffffffffffff648,
                     (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                     in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  local_168 = iVar1 != 0;
  std::__cxx11::string::~string(local_428);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator(&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_450 = 0xffffffff;
  std::__cxx11::string::string(local_470,local_18);
  local_164 = VRDataIndex::getValueWithDefault<int>
                        (in_stack_fffffffffffff648,
                         (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  std::__cxx11::string::~string(local_470);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator(&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_498 = 1;
  std::__cxx11::string::string(local_4b8,local_18);
  local_160 = VRDataIndex::getValueWithDefault<int>
                        (in_stack_fffffffffffff648,
                         (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  std::__cxx11::string::~string(local_4b8);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator(&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_4e0 = 2;
  std::__cxx11::string::string(local_500,local_18);
  local_15c = VRDataIndex::getValueWithDefault<int>
                        (in_stack_fffffffffffff648,
                         (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_528 = 8;
  std::__cxx11::string::string(local_548,local_18);
  local_158 = VRDataIndex::getValueWithDefault<int>
                        (in_stack_fffffffffffff648,
                         (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  std::__cxx11::string::~string(local_548);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator(&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_570 = 8;
  std::__cxx11::string::string(local_590,local_18);
  local_154 = VRDataIndex::getValueWithDefault<int>
                        (in_stack_fffffffffffff648,
                         (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  std::__cxx11::string::~string(local_590);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator(&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_5b8 = 0x18;
  std::__cxx11::string::string(local_5d8,local_18);
  local_150 = VRDataIndex::getValueWithDefault<int>
                        (in_stack_fffffffffffff648,
                         (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_600 = 8;
  std::__cxx11::string::string(local_620,local_18);
  local_14c = VRDataIndex::getValueWithDefault<int>
                        (in_stack_fffffffffffff648,
                         (string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  std::__cxx11::string::~string(local_620);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_648 = 0;
  std::__cxx11::string::string(local_668,local_18);
  iVar1 = VRDataIndex::getValueWithDefault<int>
                    (this,(string *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                     in_stack_fffffffffffff638,in_stack_fffffffffffff630,(bool)uVar6);
  local_148 = iVar1 != 0;
  std::__cxx11::string::~string(local_668);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator(&local_641);
  defaultVal = &local_689;
  nameSpace_00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_690 = 1;
  std::__cxx11::string::string(local_6b0,local_18);
  iVar2 = VRDataIndex::getValueWithDefault<int>
                    (this,(string *)CONCAT44(iVar1,in_stack_fffffffffffff640),(int *)defaultVal,
                     (string *)nameSpace_00,(bool)uVar6);
  local_147 = iVar2 != 0;
  std::__cxx11::string::~string(local_6b0);
  uVar6 = (undefined1)((uint)iVar2 >> 0x18);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator(&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_6d8 = 1;
  std::__cxx11::string::string(local_6f8,local_18);
  iVar2 = VRDataIndex::getValueWithDefault<int>
                    (this,(string *)CONCAT44(iVar1,in_stack_fffffffffffff640),(int *)defaultVal,
                     (string *)nameSpace_00,(bool)uVar6);
  local_146 = iVar2 != 0;
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10,
             (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f0);
  local_720 = 1;
  std::__cxx11::string::string(local_740,local_18);
  iVar2 = VRDataIndex::getValueWithDefault<int>
                    (this,(string *)CONCAT44(iVar1,in_stack_fffffffffffff640),(int *)defaultVal,
                     (string *)nameSpace_00,(bool)uVar6);
  local_145 = iVar2 != 0;
  std::__cxx11::string::~string(local_740);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator(&local_719);
  __a = &local_761;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10,
             (char *)CONCAT44(iVar2,in_stack_fffffffffffff5f8),__a);
  local_768 = 0;
  std::__cxx11::string::string(local_788,local_18);
  iVar3 = VRDataIndex::getValueWithDefault<int>
                    (this,(string *)CONCAT44(iVar1,in_stack_fffffffffffff640),(int *)defaultVal,
                     (string *)nameSpace_00,(bool)uVar6);
  local_144 = iVar3 != 0;
  std::__cxx11::string::~string(local_788);
  std::__cxx11::string::~string(local_760);
  std::allocator<char>::~allocator(&local_761);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10,
             (char *)CONCAT44(iVar2,in_stack_fffffffffffff5f8),__a);
  std::__cxx11::string::string((string *)&stack0xfffffffffffff830,local_18);
  local_140 = VRDataIndex::getValueWithDefault<int>
                        (this,(string *)CONCAT44(iVar1,in_stack_fffffffffffff640),(int *)defaultVal,
                         (string *)nameSpace_00,(bool)uVar6);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff830);
  std::__cxx11::string::~string(local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  pVVar5 = (VRDisplayNode *)operator_new(0xf8);
  VRGraphicsWindowNode
            (in_stack_fffffffffffff830,(string *)in_stack_fffffffffffff828,(VRGraphicsToolkit *)key,
             (VRWindowToolkit *)nameSpace_01,(VRWindowSettings *)settings_00.datum);
  VRWindowSettings::~VRWindowSettings((VRWindowSettings *)0x172a31);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return pVVar5;
}

Assistant:

VRDisplayNode* VRGraphicsWindowNode::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace)
{
  std::string nodeNameSpace = nameSpace;

    std::string gtk = config->getValue("GraphicsToolkit", nodeNameSpace);
  VRGraphicsToolkit *gfxToolkit = vrMain->getGraphicsToolkit(gtk);
    if (gfxToolkit == NULL) {
      std::cerr << "Cannot get the graphics toolkit named: " << gtk << std::endl;
    }

  std::string wtk = config->getValue("WindowToolkit", nameSpace);
    VRWindowToolkit *winToolkit = vrMain->getWindowToolkit(wtk);
    if (winToolkit == NULL) {
      std::cerr << "Cannot get the window toolkit named: " << wtk << std::endl;
    }

  VRWindowSettings settings;
  settings.xpos = config->getValueWithDefault("XPos", 100, nameSpace);
  settings.ypos = config->getValueWithDefault("YPos", 100, nameSpace);
  settings.width = config->getValueWithDefault("Width", 640, nameSpace);
  settings.height = config->getValueWithDefault("Height", 640, nameSpace);
  settings.border = (int)config->getValueWithDefault("Border", 0, nameSpace);
  settings.visible = (int)config->getValueWithDefault("Visible", 0, nameSpace);
  settings.caption = std::string(config->getValueWithDefault("Caption", std::string("MinVR Window"), nameSpace));
  settings.quadBuffered = (int)config->getValueWithDefault("QuadBuffered", 0, nameSpace);
  settings.sharedContextGroupID = int(config->getValueWithDefault("SharedContextGroupID", -1, nameSpace));
  settings.contextVersionMajor = int(config->getValueWithDefault("ContextVersionMajor", 1, nameSpace));
  settings.contextVersionMinor = int(config->getValueWithDefault("ContextVersionMinor", 2, nameSpace));
  settings.rgbBits = int(config->getValueWithDefault("RGBBits", 8, nameSpace));
  settings.alphaBits = int(config->getValueWithDefault("AlphaBits", 8, nameSpace));
  settings.depthBits = int(config->getValueWithDefault("DepthBits", 24, nameSpace));
  settings.stencilBits = int(config->getValueWithDefault("StencilBits", 8, nameSpace));
  settings.fullScreen = int(config->getValueWithDefault("FullScreen", 0, nameSpace));
  settings.resizable = int(config->getValueWithDefault("Resizable", 1, nameSpace));
  settings.allowMaximize = int(config->getValueWithDefault("AllowMaximize", 1, nameSpace));
  settings.gpuAffinity = int(config->getValueWithDefault("UseGPUAffinity", 1, nameSpace));
  settings.debugContext = int(config->getValueWithDefault("UseDebugContext", 0, nameSpace));
  settings.msaaSamples = int(config->getValueWithDefault("MSAASamples", 0, nameSpace));

  //  std::cout << "Window corners: " << settings.xpos << ", " << settings.ypos << ", " << settings.width << ", " << settings.height << std::endl;

  VRDisplayNode *node = new VRGraphicsWindowNode(nameSpace, gfxToolkit, winToolkit, settings);

  return node;
}